

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressInRegister.cpp
# Opt level: O2

Expression * __thiscall IRT::AddressInRegister::ToExpression(AddressInRegister *this)

{
  TempExpression *this_00;
  Temporary local_30;
  
  this_00 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->temp_);
  TempExpression::TempExpression(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return &this_00->super_Expression;
}

Assistant:

Expression* AddressInRegister::ToExpression() {
  return new TempExpression(temp_);
}